

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O0

CloningFilter * __thiscall
helics::ConnectorFederateManager::registerCloningFilter
          (ConnectorFederateManager *this,string_view name,string_view type_in,string_view type_out)

{
  string_view message;
  string_view searchValue;
  string_view searchValue_00;
  bool bVar1;
  StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
  *this_00;
  size_t sVar2;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  handle filts;
  CloningFilter *filt;
  __single_object filtPtr;
  InterfaceHandle handle;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  char *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb8;
  type pCVar3;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_fffffffffffffed8;
  StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
  *in_stack_fffffffffffffee0;
  Federate **in_stack_fffffffffffffee8;
  char *pcVar4;
  lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  local_98;
  type local_70;
  char local_68 [60];
  InterfaceHandle local_2c [7];
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_2c[0].hid =
       (**(code **)(*(long *)*in_RDI + 0x1d0))((long *)*in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  bVar1 = InterfaceHandle::isValid(local_2c);
  if (!bVar1) {
    this_01 = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_01,in_stack_fffffffffffffea8);
    message._M_str._0_7_ = in_stack_fffffffffffffec0;
    message._M_len = in_stack_fffffffffffffeb8;
    message._M_str._7_1_ = in_stack_fffffffffffffec7;
    RegistrationFailure::RegistrationFailure((RegistrationFailure *)this_01,message);
    __cxa_throw(this_01,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
  }
  pcVar4 = local_68;
  std::
  make_unique<helics::CloningFilter,helics::Federate*&,std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle&>
            (in_stack_fffffffffffffee8,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             (InterfaceHandle *)in_stack_fffffffffffffed8);
  local_70 = std::unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>::
             operator*((unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
                        *)in_stack_00000010);
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(in_stack_fffffffffffffed8);
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
  if (bVar1) {
    this_00 = gmlc::libguarded::
              lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
              ::operator->(&local_98);
    sVar2 = (**(code **)(*(long *)*in_RDI + 0x140))((long *)*in_RDI,local_2c[0].hid);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_00000010);
    searchValue._M_str = pcVar4;
    searchValue._M_len = sVar2;
    gmlc::containers::
    StringMappedVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,(reference_stability)0,5>
    ::insert<std::unique_ptr<helics::CloningFilter,std::default_delete<helics::CloningFilter>>>
              (this_00,searchValue,
               (unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> *)
               in_stack_fffffffffffffed8);
    this_02 = in_stack_00000010;
  }
  else {
    gmlc::libguarded::
    lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
    ::operator->(&local_98);
    searchValue_00._M_str = pcVar4;
    searchValue_00._M_len = (size_t)in_stack_fffffffffffffee8;
    gmlc::containers::
    StringMappedVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,(reference_stability)0,5>
    ::insert<std::unique_ptr<helics::CloningFilter,std::default_delete<helics::CloningFilter>>>
              (in_stack_fffffffffffffee0,searchValue_00,
               (unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> *)
               in_stack_fffffffffffffed8);
    this_02 = in_stack_00000010;
  }
  pCVar3 = local_70;
  gmlc::libguarded::
  lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
                  *)0x3e14a8);
  std::unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>::~unique_ptr
            ((unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> *)
             this_02);
  return pCVar3;
}

Assistant:

CloningFilter& ConnectorFederateManager::registerCloningFilter(std::string_view name,
                                                               std::string_view type_in,
                                                               std::string_view type_out)
{
    auto handle = coreObject->registerCloningFilter(name, type_in, type_out);
    if (handle.isValid()) {
        auto filtPtr = std::make_unique<CloningFilter>(fed, name, handle);
        CloningFilter& filt = *filtPtr;
        auto filts = filters.lock();
        if (name.empty()) {
            filts->insert(coreObject->getHandleName(handle), std::move(filtPtr));
        } else {
            filts->insert(name, std::move(filtPtr));
        }
        return filt;
    }
    throw(RegistrationFailure("Unable to register Filter"));
}